

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O1

Vector3d * gmath::averageAngleAxis(Vector3d *__return_storage_ptr__,int n,Vector3d *v)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  int i;
  long lVar4;
  Vector3d *pVVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  int k;
  double (*padVar7) [3];
  long lVar8;
  double (*padVar9) [3];
  int j;
  long lVar10;
  int i_5;
  double ret;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Matrix33d R;
  SMatrix<double,_3,_3> ret_2;
  Vector3d N;
  vector<double,_std::allocator<double>_> fvec;
  Matrix33d R0;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  double local_148;
  Vector3d local_138;
  undefined8 uStack_120;
  undefined8 local_118 [6];
  int local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  Vector3d local_d8;
  vector<double,_std::allocator<double>_> local_c0 [3];
  double local_78;
  double dStack_70;
  double local_68;
  
  if (n < 1) {
    __return_storage_ptr__->v[0] = 0.0;
    __return_storage_ptr__->v[1] = 0.0;
    __return_storage_ptr__->v[2] = 0.0;
  }
  else if (n == 2) {
    dVar11 = 0.0;
    lVar4 = 0;
    do {
      dVar11 = dVar11 + v->v[lVar4] * v->v[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    createR((Matrix33d *)&local_78,v,dVar11);
    lVar4 = 0;
    dVar11 = 0.0;
    do {
      dVar1 = v[1].v[lVar4];
      dVar11 = dVar11 + dVar1 * dVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    padVar9 = (double (*) [3])local_c0;
    createR((Matrix33d *)padVar9,v + 1,dVar11);
    lVar4 = 0;
    local_d8.v[2] = 0.0;
    local_d8.v[0] = 0.0;
    local_d8.v[1] = 0.0;
    local_118[4] = 0;
    local_118[2] = 0;
    local_118[3] = 0;
    local_118[0] = 0;
    local_118[1] = 0;
    local_138.v[2] = 0.0;
    uStack_120 = 0;
    local_138.v._0_16_ = ZEXT816(0);
    auVar12 = _DAT_00121070;
    do {
      if (SUB164(auVar12 ^ _DAT_00121080,4) == -0x80000000 &&
          SUB164(auVar12 ^ _DAT_00121080,0) < -0x7ffffffd) {
        *(undefined8 *)((long)local_138.v + lVar4) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_118 + lVar4) = 0x3ff0000000000000;
      }
      lVar8 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar8 + 2;
      lVar4 = lVar4 + 0x40;
    } while (lVar4 != 0x80);
    pVVar5 = &local_138;
    lVar4 = 0;
    do {
      lVar8 = 0;
      padVar7 = padVar9;
      do {
        pVVar5->v[lVar8] = (*(double (*) [3])*padVar7)[0];
        lVar8 = lVar8 + 1;
        padVar7 = padVar7 + 1;
      } while (lVar8 != 3);
      lVar4 = lVar4 + 1;
      pVVar5 = pVVar5 + 1;
      padVar9 = (double (*) [3])(*padVar9 + 1);
    } while (lVar4 != 3);
    local_158 = (undefined1  [16])0x0;
    local_168 = (undefined1  [16])0x0;
    local_178 = (undefined1  [16])0x0;
    local_188 = (undefined1  [16])0x0;
    local_148 = 0.0;
    lVar4 = 0;
    auVar13 = _DAT_00121070;
    do {
      if (SUB164(auVar13 ^ _DAT_00121080,4) == -0x80000000 &&
          SUB164(auVar13 ^ _DAT_00121080,0) < -0x7ffffffd) {
        *(undefined8 *)(local_188 + lVar4) = 0x3ff0000000000000;
        *(undefined8 *)(local_168 + lVar4) = 0x3ff0000000000000;
      }
      lVar8 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar8 + 2;
      lVar4 = lVar4 + 0x40;
    } while (lVar4 != 0x80);
    local_e8 = -0x80000000;
    uStack_e4 = 0x80000000;
    uStack_e0 = 0x80000000;
    uStack_dc = 0x80000000;
    pVVar5 = &local_138;
    lVar4 = 0;
    do {
      lVar8 = 0;
      padVar9 = (double (*) [3])&local_78;
      do {
        *(double *)(local_188 + lVar8 * 8 + lVar4 * 0x18) = 0.0;
        dVar11 = 0.0;
        lVar10 = 0;
        padVar7 = padVar9;
        do {
          dVar11 = dVar11 + pVVar5->v[lVar10] * (*(double (*) [3])*padVar7)[0];
          lVar10 = lVar10 + 1;
          padVar7 = padVar7 + 1;
        } while (lVar10 != 3);
        *(double *)(local_188 + lVar8 * 8 + lVar4 * 0x18) = dVar11;
        lVar8 = lVar8 + 1;
        padVar9 = (double (*) [3])(*padVar9 + 1);
      } while (lVar8 != 3);
      lVar4 = lVar4 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar4 != 3);
    dVar11 = recoverAngleAxis((Matrix33d *)local_188,&local_d8);
    createR((Matrix33d *)local_138.v,&local_d8,dVar11 * 0.5);
    iVar2 = local_e8;
    local_158 = ZEXT816(0);
    local_168 = ZEXT816(0);
    local_178 = ZEXT816(0);
    local_188 = ZEXT816(0);
    local_148 = 0.0;
    lVar4 = 0;
    auVar14 = _DAT_00121070;
    do {
      if (SUB164(auVar14 ^ _DAT_00121080,4) == iVar2 &&
          SUB164(auVar14 ^ _DAT_00121080,0) < -0x7ffffffd) {
        *(undefined8 *)(local_188 + lVar4) = 0x3ff0000000000000;
        *(undefined8 *)(local_168 + lVar4) = 0x3ff0000000000000;
      }
      lVar8 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar8 + 2;
      lVar4 = lVar4 + 0x40;
    } while (lVar4 != 0x80);
    pvVar6 = local_c0;
    lVar4 = 0;
    do {
      lVar8 = 0;
      padVar9 = &local_138.v;
      do {
        *(double *)(local_188 + lVar8 * 8 + lVar4 * 0x18) = 0.0;
        dVar11 = 0.0;
        lVar10 = 0;
        padVar7 = padVar9;
        do {
          dVar11 = dVar11 + (double)(&(pvVar6->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data._M_start)[lVar10] *
                            (*(double (*) [3])*padVar7)[0];
          lVar10 = lVar10 + 1;
          padVar7 = padVar7 + 1;
        } while (lVar10 != 3);
        *(double *)(local_188 + lVar8 * 8 + lVar4 * 0x18) = dVar11;
        lVar8 = lVar8 + 1;
        padVar9 = (double (*) [3])(*padVar9 + 1);
      } while (lVar8 != 3);
      lVar4 = lVar4 + 1;
      pvVar6 = pvVar6 + 1;
    } while (lVar4 != 3);
    lVar4 = 0;
    local_138.v[2] = 0.0;
    local_138.v[0] = 0.0;
    local_138.v[1] = 0.0;
    dVar11 = recoverAngleAxis((Matrix33d *)local_188,&local_138);
    __return_storage_ptr__->v[0] = 0.0;
    __return_storage_ptr__->v[1] = 0.0;
    __return_storage_ptr__->v[2] = 0.0;
    do {
      __return_storage_ptr__->v[lVar4] = local_138.v[lVar4] * dVar11;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
  }
  else if (n == 1) {
    __return_storage_ptr__->v[2] = v->v[2];
    dVar11 = v->v[1];
    __return_storage_ptr__->v[0] = v->v[0];
    __return_storage_ptr__->v[1] = dVar11;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              (local_c0,(ulong)(uint)n,(allocator_type *)local_188);
    local_78 = v->v[0];
    dStack_70 = v->v[1];
    local_68 = v->v[2];
    bVar3 = slmdif(anon_unknown_23::averageAngleAxisOpt,n,3,&local_78,
                   local_c0[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,v,1e-09,1e-09,(long *)0x0,(double *)0x0);
    if (bVar3) {
      __return_storage_ptr__->v[0] = local_78;
      __return_storage_ptr__->v[1] = dStack_70;
      __return_storage_ptr__->v[2] = local_68;
    }
    else {
      __return_storage_ptr__->v[0] = 0.0;
      __return_storage_ptr__->v[1] = 0.0;
      __return_storage_ptr__->v[2] = 0.0;
    }
    if (local_c0[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_c0[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d averageAngleAxis(int n, Vector3d v[])
{
  if (n <= 0)
  {
    return Vector3d();
  }

  if (n == 1)
  {
    return v[0];
  }

  if (n == 2)
  {
    Matrix33d R0=createR(v[0]);
    Matrix33d R1=createR(v[1]);

    Vector3d N;
    double phi=recoverAngleAxis(transpose(R1)*R0, N);
    Matrix33d R=R1*createR(N, phi/2);

    return recoverAngleAxis(R);
  }

  // for all n >= 3

  double x[3];
  std::vector<double> fvec(n);

  // taking first rotation as start value

  x[0]=v[0][0];
  x[1]=v[0][1];
  x[2]=v[0][2];

  // optimize

  if (slmdif(averageAngleAxisOpt, n, 3, x, fvec.data(), v, 1e-9, 1e-9))
  {
    return Vector3d(x[0], x[1], x[2]);
  }

  return Vector3d();
}